

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereIsCoveringIndexWalkCallback(Walker *pWalk,Expr *pExpr)

{
  Index *pIVar1;
  u16 nColumn;
  i16 *aiColumn;
  Index *pIdx;
  int i;
  Expr *pExpr_local;
  Walker *pWalk_local;
  
  if ((pExpr->op == 0xa7) || (pExpr->op == 0xa9)) {
    if (pExpr->iColumn < 0x3f) {
      pWalk_local._4_4_ = 0;
    }
    else if (pExpr->iTable == ((pWalk->u).pIdxCover)->iCur) {
      pIVar1 = ((pWalk->u).pIdxCover)->pIdx;
      for (pIdx._4_4_ = 0; pIdx._4_4_ < (int)(uint)pIVar1->nColumn; pIdx._4_4_ = pIdx._4_4_ + 1) {
        if (pIVar1->aiColumn[pIdx._4_4_] == pExpr->iColumn) {
          return 0;
        }
      }
      pWalk->eCode = 1;
      pWalk_local._4_4_ = 2;
    }
    else {
      pWalk_local._4_4_ = 0;
    }
  }
  else {
    pWalk_local._4_4_ = 0;
  }
  return pWalk_local._4_4_;
}

Assistant:

static int whereIsCoveringIndexWalkCallback(Walker *pWalk, Expr *pExpr){
  int i;                  /* Loop counter */
  const Index *pIdx;      /* The index of interest */
  const i16 *aiColumn;    /* Columns contained in the index */
  u16 nColumn;            /* Number of columns in the index */
  if( pExpr->op!=TK_COLUMN && pExpr->op!=TK_AGG_COLUMN ) return WRC_Continue;
  if( pExpr->iColumn<(BMS-1) ) return WRC_Continue;
  if( pExpr->iTable!=pWalk->u.pCovIdxCk->iTabCur ) return WRC_Continue;
  pIdx = pWalk->u.pCovIdxCk->pIdx;
  aiColumn = pIdx->aiColumn;
  nColumn = pIdx->nColumn;
  for(i=0; i<nColumn; i++){
    if( aiColumn[i]==pExpr->iColumn ) return WRC_Continue;
  }
  pWalk->eCode = 1;
  return WRC_Abort;
}